

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring64map_checked.hh
# Opt level: O3

void __thiscall doublechecked::Roaring64Map::Roaring64Map(Roaring64Map *this,Roaring64Map *r)

{
  _Rb_tree_header *p_Var1;
  
  p_Var1 = &(this->plain).roarings._M_t._M_impl.super__Rb_tree_header;
  *(undefined8 *)&(this->plain).roarings._M_t._M_impl = 0;
  *(undefined8 *)&(this->plain).roarings._M_t._M_impl.super__Rb_tree_header._M_header = 0;
  (this->plain).roarings._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->plain).roarings._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->plain).roarings._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->plain).roarings._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->plain).copyOnWrite = false;
  p_Var1 = &(this->check)._M_t._M_impl.super__Rb_tree_header;
  (this->check)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->check)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->check)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->check)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->check)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  std::
  _Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_roaring::Roaring>,_std::_Select1st<std::pair<const_unsigned_int,_roaring::Roaring>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_roaring::Roaring>_>_>
  ::operator=((_Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_roaring::Roaring>,_std::_Select1st<std::pair<const_unsigned_int,_roaring::Roaring>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_roaring::Roaring>_>_>
               *)this,(_Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_roaring::Roaring>,_std::_Select1st<std::pair<const_unsigned_int,_roaring::Roaring>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_roaring::Roaring>_>_>
                       *)r);
  (this->plain).copyOnWrite = (r->plain).copyOnWrite;
  std::
  _Rb_tree<unsigned_long,_unsigned_long,_std::_Identity<unsigned_long>,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>
  ::operator=(&(this->check)._M_t,&(r->check)._M_t);
  return;
}

Assistant:

Roaring64Map(const Roaring64Map &r) {
        plain = r.plain;
        check = r.check;
    }